

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

void rw::ps2::genericPreCB(MatPipeline *pipe,Geometry *geo)

{
  uint32 uVar1;
  long lVar2;
  void *__s;
  ulong __n;
  
  lVar2 = 4;
  do {
    if (pipe->attribs[lVar2 + -4] == (PipeAttribute *)attribXYZW) {
      lVar2 = (long)adcOffset;
      *(undefined4 *)((long)geo->texCoords + lVar2 + -0x38) = 1;
      uVar1 = geo->meshHeader->totalIndices;
      *(uint32 *)((long)geo->texCoords + lVar2 + -0x28) = uVar1;
      __n = (long)(int)uVar1 + 3U & 0xfffffffffffffffc;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 1224"
      ;
      __s = (void *)(*DAT_00149de8)(__n);
      *(void **)((long)geo->texCoords + lVar2 + -0x30) = __s;
      memset(__s,0,__n);
      break;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe);
  skinPreCB(pipe,geo);
  return;
}

Assistant:

void
genericPreCB(MatPipeline *pipe, Geometry *geo)
{
	PipeAttribute *a;
	for(int32 i = 0; i < (int)nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]))
			if(a == &attribXYZW){
				allocateADC(geo);
				break;
			}
	skinPreCB(pipe, geo);
}